

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RelationsGraph.h
# Opt level: O2

Bucket * __thiscall
dg::vr::RelationsGraph<dg::vr::ValueRelations>::getBorderBucket
          (RelationsGraph<dg::vr::ValueRelations> *this,size_t id)

{
  Bucket *__args_1;
  size_t local_20;
  
  local_20 = id;
  __args_1 = getNewBucket(this);
  std::
  vector<std::pair<unsigned_long,std::reference_wrapper<dg::vr::Bucket_const>>,std::allocator<std::pair<unsigned_long,std::reference_wrapper<dg::vr::Bucket_const>>>>
  ::emplace_back<unsigned_long&,dg::vr::Bucket_const&>
            ((vector<std::pair<unsigned_long,std::reference_wrapper<dg::vr::Bucket_const>>,std::allocator<std::pair<unsigned_long,std::reference_wrapper<dg::vr::Bucket_const>>>>
              *)&this->borderBuckets,&local_20,__args_1);
  return __args_1;
}

Assistant:

const Bucket &getBorderBucket(size_t id) {
        const Bucket &bucket = getNewBucket();
        assert(getBorderB(id) == nullptr);
        borderBuckets.emplace_back(id, bucket);
        return bucket;
    }